

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_byte(lua_State *L)

{
  int iVar1;
  int space;
  size_t in_RAX;
  char *pcVar2;
  lua_Integer def;
  size_t sVar3;
  long lVar4;
  long lVar5;
  size_t l;
  
  l = in_RAX;
  pcVar2 = luaL_checklstring(L,1,&l);
  def = luaL_optinteger(L,2,1);
  if (def < 0) {
    if (l < (ulong)-def) {
      def = 0;
    }
    else {
      def = def + l + 1;
    }
  }
  sVar3 = luaL_optinteger(L,3,def);
  if ((long)sVar3 < 0) {
    if (l < -sVar3) {
      sVar3 = 0;
    }
    else {
      sVar3 = sVar3 + l + 1;
    }
  }
  lVar5 = 1;
  if (1 < def) {
    lVar5 = def;
  }
  if ((long)sVar3 < (long)l) {
    l = sVar3;
  }
  space = 0;
  if (lVar5 <= (long)l) {
    if ((long)(l - lVar5) < 0x7fffffff) {
      iVar1 = (int)(l - lVar5);
      space = iVar1 + 1;
      luaL_checkstack(L,space,"string slice too long");
      for (lVar4 = 0; lVar4 <= iVar1; lVar4 = lVar4 + 1) {
        lua_pushinteger(L,(ulong)(byte)pcVar2[lVar4 + lVar5 + -1]);
      }
    }
    else {
      space = luaL_error(L,"string slice too long");
    }
  }
  return space;
}

Assistant:

static int str_byte (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  lua_Integer posi = posrelat(luaL_optinteger(L, 2, 1), l);
  lua_Integer pose = posrelat(luaL_optinteger(L, 3, posi), l);
  int n, i;
  if (posi < 1) posi = 1;
  if (pose > (lua_Integer)l) pose = l;
  if (posi > pose) return 0;  /* empty interval; return no values */
  if (pose - posi >= INT_MAX)  /* arithmetic overflow? */
    return luaL_error(L, "string slice too long");
  n = (int)(pose -  posi) + 1;
  luaL_checkstack(L, n, "string slice too long");
  for (i=0; i<n; i++)
    lua_pushinteger(L, uchar(s[posi+i-1]));
  return n;
}